

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  seqDef *psVar5;
  int iVar6;
  bool bVar7;
  undefined8 uVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  int *mEnd;
  BYTE *pBVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  BYTE *pBVar17;
  int iVar18;
  int *piVar19;
  uint uVar20;
  uint uVar21;
  U32 UVar22;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  size_t sVar26;
  size_t offset2;
  int *local_d8;
  int *local_c8;
  size_t local_a8;
  int *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  int *local_80;
  uint local_74;
  int *local_70;
  ZSTD_matchState_t *local_68;
  BYTE *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_98 = pBVar3 + uVar2;
  uVar21 = *rep;
  pZVar4 = ms->dictMatchState;
  local_a0 = (int *)(pZVar4->window).nextSrc;
  local_88 = (pZVar4->window).base;
  local_60 = local_88 + (pZVar4->window).dictLimit;
  iVar18 = (int)local_a0;
  uVar9 = ((int)src - ((int)local_60 + (int)local_98)) + iVar18;
  local_68 = ms;
  if (uVar9 < uVar21) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar19 = (int *)((long)src + (ulong)(uVar9 == 0));
  uVar23 = rep[1];
  if (uVar9 < uVar23) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  local_d8 = (int *)src;
  if (piVar19 < local_80) {
    local_74 = ((int)local_88 - iVar18) + uVar2;
    local_90 = local_88 + -(ulong)local_74;
    local_70 = iEnd + -8;
    iVar12 = (int)pBVar3;
    local_48 = (ulong)((1 - uVar2) - iVar12);
    local_50 = (ulong)(uint)-iVar12;
    local_58 = (ulong)((((iVar18 - uVar2) - (int)local_88) - iVar12) + 1);
    do {
      iVar18 = (int)piVar19;
      uVar9 = ((iVar18 - iVar12) - uVar21) + 1;
      piVar14 = (int *)(pBVar3 + uVar9);
      if (uVar9 < uVar2) {
        piVar14 = (int *)(local_88 + (uVar9 - local_74));
      }
      if ((uVar9 - uVar2 < 0xfffffffd) && (*piVar14 == *(int *)((long)piVar19 + 1))) {
        piVar25 = iEnd;
        if (uVar9 < uVar2) {
          piVar25 = local_a0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar25,local_98);
        uVar24 = sVar10 + 4;
      }
      else {
        uVar24 = 0;
      }
      local_a8 = 999999999;
      sVar11 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                         (local_68,(BYTE *)piVar19,(BYTE *)iEnd,&local_a8);
      sVar10 = uVar24;
      if (uVar24 < sVar11) {
        sVar10 = sVar11;
      }
      if (sVar10 < 4) {
        piVar19 = (int *)((long)piVar19 + ((long)piVar19 - (long)local_d8 >> 8) + 1);
      }
      else {
        local_c8 = piVar19;
        sVar26 = local_a8;
        if (sVar11 <= uVar24) {
          local_c8 = (int *)((long)piVar19 + 1);
          sVar26 = 0;
        }
        local_38 = (ulong)(((int)local_48 + iVar18) - uVar21);
        local_40 = (ulong)(((int)local_50 + iVar18) - uVar21);
        iVar6 = (int)local_58;
        lVar16 = 0;
        do {
          if (local_80 <= (int *)(lVar16 + (long)piVar19)) break;
          piVar25 = (int *)((long)piVar19 + lVar16 + 1);
          iVar15 = (int)lVar16;
          uVar9 = (int)local_40 + iVar15 + 1;
          piVar14 = (int *)(pBVar3 + uVar9);
          if (uVar9 < uVar2) {
            piVar14 = (int *)(local_88 + (((iVar6 + iVar18) - uVar21) + iVar15));
          }
          if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar14 == *piVar25)) {
            mEnd = iEnd;
            if (uVar9 < uVar2) {
              mEnd = local_a0;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar19 + lVar16 + 5),(BYTE *)(piVar14 + 1),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_98);
            uVar9 = (int)sVar26 + 1;
            if (uVar9 == 0) goto LAB_0013e53f;
            if (sVar11 < 0xfffffffffffffffc) {
              uVar20 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                }
              }
              if ((int)((uVar20 ^ 0x1f) + (int)sVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                sVar26 = 0;
                sVar10 = sVar11 + 4;
                local_c8 = piVar25;
              }
            }
          }
          local_a8 = 999999999;
          sVar11 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                             (local_68,(BYTE *)piVar25,(BYTE *)iEnd,&local_a8);
          uVar9 = (int)local_a8 + 1;
          if ((uVar9 == 0) || (uVar20 = (int)sVar26 + 1, uVar20 == 0)) {
LAB_0013e53f:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x12c2,"U32 ZSTD_highbit32(U32)");
          }
          bVar7 = true;
          if (3 < sVar11) {
            iVar15 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar9 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            if ((int)((uVar9 ^ 0x1f) + (int)sVar10 * 4 + -0x1b) < (int)sVar11 * 4 - iVar15) {
              bVar7 = false;
              sVar26 = local_a8;
              sVar10 = sVar11;
              local_c8 = piVar25;
            }
          }
          lVar16 = lVar16 + 1;
        } while (!bVar7);
        if (sVar26 == 0) {
          UVar22 = 1;
          uVar9 = uVar21;
        }
        else {
          uVar24 = (long)local_c8 + (-(long)pBVar3 - sVar26) + -0xfffffffe;
          pBVar13 = pBVar3;
          pBVar17 = local_98;
          if ((uint)uVar24 < uVar2) {
            pBVar13 = local_90;
            pBVar17 = local_60;
          }
          if ((local_d8 < local_c8) && (uVar24 = uVar24 & 0xffffffff, pBVar17 < pBVar13 + uVar24)) {
            pBVar13 = pBVar13 + uVar24;
            do {
              piVar19 = (int *)((long)local_c8 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar19 != *pBVar13) ||
                 (sVar10 = sVar10 + 1, local_c8 = piVar19, piVar19 <= local_d8)) break;
            } while (pBVar17 < pBVar13);
          }
          UVar22 = (int)sVar26 + 1;
          uVar9 = (int)sVar26 - 2;
          uVar23 = uVar21;
        }
        uVar21 = uVar9;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0013e57d:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0013e55e:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar24 = (long)local_c8 - (long)local_d8;
        pBVar17 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar17 + uVar24) {
LAB_0013e5bb:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_c8) {
LAB_0013e59c:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_70 < local_c8) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_d8,(BYTE *)local_c8,(BYTE *)local_70);
        }
        else {
          uVar8 = *(undefined8 *)(local_d8 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_d8;
          *(undefined8 *)(pBVar17 + 8) = uVar8;
          if (0x10 < uVar24) {
            pBVar13 = seqStore->lit;
            pBVar17 = pBVar13 + 0x10;
            piVar19 = local_d8 + 4;
            if ((BYTE *)0xffffffffffffffe8 < pBVar17 + (-8 - (long)piVar19)) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + (-0x10 - (long)piVar19)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(local_d8 + 6);
            *(undefined8 *)pBVar17 = *(undefined8 *)piVar19;
            *(undefined8 *)(pBVar13 + 0x18) = uVar8;
            if (0x20 < (long)uVar24) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d8 + lVar16 + 0x20);
                uVar8 = puVar1[1];
                pBVar17 = pBVar13 + lVar16 + 0x20;
                *(undefined8 *)pBVar17 = *puVar1;
                *(undefined8 *)(pBVar17 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_d8 + lVar16 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar17 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar17 + 0x18) = uVar8;
                lVar16 = lVar16 + 0x20;
              } while (pBVar17 + 0x20 < pBVar13 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5 = seqStore->sequences;
        psVar5->litLength = (U16)uVar24;
        psVar5->offset = UVar22;
        if (0xffff < sVar10 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_0013e5da:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5->matchLength = (U16)(sVar10 - 3);
        seqStore->sequences = psVar5 + 1;
        piVar19 = (int *)((long)local_c8 + sVar10);
        pBVar17 = local_90;
        local_d8 = piVar19;
        do {
          if (local_80 < piVar19) break;
          uVar9 = ((int)piVar19 - iVar12) - uVar23;
          pBVar13 = pBVar3;
          if (uVar9 < uVar2) {
            pBVar13 = pBVar17;
          }
          if ((uVar9 - uVar2 < 0xfffffffd) && (*(int *)(pBVar13 + uVar9) == *piVar19)) {
            piVar14 = iEnd;
            if (uVar9 < uVar2) {
              piVar14 = local_a0;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar13 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar14,local_98);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0013e57d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0013e55e;
            pBVar17 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar17) goto LAB_0013e5bb;
            if (iEnd < local_d8) goto LAB_0013e59c;
            if (local_70 < local_d8) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)local_70);
            }
            else {
              uVar8 = *(undefined8 *)(local_d8 + 2);
              *(undefined8 *)pBVar17 = *(undefined8 *)local_d8;
              *(undefined8 *)(pBVar17 + 8) = uVar8;
            }
            psVar5 = seqStore->sequences;
            psVar5->litLength = 0;
            psVar5->offset = 1;
            if (0xffff < sVar10 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_0013e5da;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar5->matchLength = (U16)(sVar10 + 1);
            seqStore->sequences = psVar5 + 1;
            piVar19 = (int *)((long)piVar19 + sVar10 + 4);
            bVar7 = true;
            pBVar17 = local_90;
            uVar9 = uVar21;
            uVar21 = uVar23;
            local_d8 = piVar19;
          }
          else {
            bVar7 = false;
            uVar9 = uVar23;
          }
          uVar23 = uVar9;
        } while (bVar7);
      }
    } while (piVar19 < local_80);
  }
  *rep = uVar21;
  rep[1] = uVar23;
  return (long)iEnd - (long)local_d8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}